

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::anon_unknown_1::multalpha<float>
               (float *data,int npixels,int nchannels,int alphachan,float scale)

{
  float fVar1;
  float *pfVar2;
  int i;
  float aval;
  float *end;
  int nchanmult;
  int alphaoffset;
  float scale_local;
  int alphachan_local;
  int nchannels_local;
  int npixels_local;
  float *data_local;
  
  nchanmult = alphachan;
  alphaoffset = alphachan;
  data_local = data;
  if (alphachan == 0) {
    data_local = data + 1;
    alphaoffset = -1;
    nchanmult = nchannels + -1;
  }
  pfVar2 = data_local + npixels * nchannels;
  for (; data_local != pfVar2; data_local = data_local + nchannels) {
    fVar1 = data_local[alphaoffset];
    for (i = 0; i < nchanmult; i = i + 1) {
      data_local[i] = data_local[i] * scale * fVar1;
    }
  }
  return;
}

Assistant:

inline void multalpha(T* data, int npixels, int nchannels, int alphachan, float scale)
    {
        int alphaoffset; // offset to alpha chan from data ptr
        int nchanmult;   // number of channels to alpha-multiply
        if (alphachan == 0) {
            // first channel is alpha chan: mult the rest of the channels
            data++;
            alphaoffset = -1;
            nchanmult = nchannels - 1;
        }
        else {
            // mult all channels up to alpha chan
            alphaoffset = alphachan;
            nchanmult = alphachan;
        }

        for (T* end = data + npixels*nchannels; data != end; data += nchannels) {
            float aval = scale * (float)data[alphaoffset];
            for (int i = 0; i < nchanmult; i++) data[i] = T((float)data[i] * aval);
        }
    }